

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_poc_dumpparms(jpc_ms_t *ms,FILE *out)

{
  uint local_2c;
  jpc_pocpchg_t *pjStack_28;
  int pchgno;
  jpc_pocpchg_t *pchg;
  jpc_poc_t *poc;
  FILE *out_local;
  jpc_ms_t *ms_local;
  
  local_2c = 0;
  pjStack_28 = (ms->parms).poc.pchgs;
  for (; (int)local_2c < (ms->parms).soc; local_2c = local_2c + 1) {
    fprintf((FILE *)out,"po[%d] = %d; ",(ulong)local_2c,(ulong)pjStack_28->prgord);
    fprintf((FILE *)out,"cs[%d] = %lu; ce[%d] = %lu; ",(ulong)local_2c,pjStack_28->compnostart,
            (ulong)local_2c,pjStack_28->compnoend);
    fprintf((FILE *)out,"rs[%d] = %d; re[%d] = %d; ",(ulong)local_2c,(ulong)pjStack_28->rlvlnostart,
            (ulong)local_2c,(ulong)pjStack_28->rlvlnoend);
    fprintf((FILE *)out,"le[%d] = %lu\n",(ulong)local_2c,pjStack_28->lyrnoend);
    pjStack_28 = pjStack_28 + 1;
  }
  return 0;
}

Assistant:

static int jpc_poc_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_poc_t *poc = &ms->parms.poc;
	jpc_pocpchg_t *pchg;
	int pchgno;
	for (pchgno = 0, pchg = poc->pchgs; pchgno < poc->numpchgs;
	  ++pchgno, ++pchg) {
		fprintf(out, "po[%d] = %d; ", pchgno, pchg->prgord);
		fprintf(out, "cs[%d] = %"PRIuFAST16"; ce[%d] = %"PRIuFAST16"; ",
		  pchgno, pchg->compnostart, pchgno, pchg->compnoend);
		fprintf(out, "rs[%d] = %d; re[%d] = %d; ",
		  pchgno, pchg->rlvlnostart, pchgno, pchg->rlvlnoend);
		fprintf(out, "le[%d] = %"PRIuFAST16"\n", pchgno, pchg->lyrnoend);
	}
	return 0;
}